

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O2

void anon_unknown.dwarf_4cac::Test_TemplateDictionary_SetValueAndShowSection::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  bool bVar12;
  int iVar13;
  char *pcVar14;
  TemplateDictionaryPeer peer;
  string dump;
  TemplateString local_1e0;
  TemplateString local_1c0;
  TemplateString local_1a0;
  TemplateString local_180;
  TemplateString local_160;
  TemplateString local_140;
  TemplateString local_120;
  TemplateString local_100;
  TemplateString local_e0;
  TemplateString local_c0;
  TemplateString local_a0;
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString((TemplateString *)&dump,"test_SetValueAndShowSection");
  ctemplate::TemplateDictionary::TemplateDictionary
            (&dict,(TemplateString *)&dump,(UnsafeArena *)0x0);
  peer.dict_ = &dict;
  ctemplate::TemplateString::TemplateString(&local_a0,"TOPLEVEL");
  ctemplate::TemplateString::TemplateString(&local_c0,"foo");
  TVar1.length_ = local_a0.length_;
  TVar1.ptr_ = local_a0.ptr_;
  TVar1.is_immutable_ = local_a0.is_immutable_;
  TVar1._17_7_ = local_a0._17_7_;
  TVar1.id_ = local_a0.id_;
  TVar5.length_ = local_c0.length_;
  TVar5.ptr_ = local_c0.ptr_;
  TVar5.is_immutable_ = local_c0.is_immutable_;
  TVar5._17_7_ = local_c0._17_7_;
  TVar5.id_ = local_c0.id_;
  ctemplate::TemplateDictionary::SetValue(TVar1,TVar5);
  ctemplate::TemplateString::TemplateString(&local_e0,"INSEC");
  ctemplate::TemplateString::TemplateString(&local_100,"bar");
  ctemplate::TemplateString::TemplateString(&local_120,"SEC1");
  TVar2.length_ = local_e0.length_;
  TVar2.ptr_ = local_e0.ptr_;
  TVar2.is_immutable_ = local_e0.is_immutable_;
  TVar2._17_7_ = local_e0._17_7_;
  TVar2.id_ = local_e0.id_;
  TVar6.length_ = local_100.length_;
  TVar6.ptr_ = local_100.ptr_;
  TVar6.is_immutable_ = local_100.is_immutable_;
  TVar6._17_7_ = local_100._17_7_;
  TVar6.id_ = local_100.id_;
  TVar9.length_ = local_120.length_;
  TVar9.ptr_ = local_120.ptr_;
  TVar9.is_immutable_ = local_120.is_immutable_;
  TVar9._17_7_ = local_120._17_7_;
  TVar9.id_ = local_120.id_;
  ctemplate::TemplateDictionary::SetValueAndShowSection(TVar2,TVar6,TVar9);
  ctemplate::TemplateString::TemplateString(&local_140,"NOTINSEC");
  ctemplate::TemplateString::TemplateString(&local_160,"");
  ctemplate::TemplateString::TemplateString(&local_180,"SEC2");
  TVar3.length_ = local_140.length_;
  TVar3.ptr_ = local_140.ptr_;
  TVar3.is_immutable_ = local_140.is_immutable_;
  TVar3._17_7_ = local_140._17_7_;
  TVar3.id_ = local_140.id_;
  TVar7.length_ = local_160.length_;
  TVar7.ptr_ = local_160.ptr_;
  TVar7.is_immutable_ = local_160.is_immutable_;
  TVar7._17_7_ = local_160._17_7_;
  TVar7.id_ = local_160.id_;
  TVar10.length_ = local_180.length_;
  TVar10.ptr_ = local_180.ptr_;
  TVar10.is_immutable_ = local_180.is_immutable_;
  TVar10._17_7_ = local_180._17_7_;
  TVar10.id_ = local_180.id_;
  ctemplate::TemplateDictionary::SetValueAndShowSection(TVar3,TVar7,TVar10);
  ctemplate::TemplateString::TemplateString(&local_1a0,"NOTINSEC2");
  ctemplate::TemplateString::TemplateString(&local_1c0,(char *)0x0);
  ctemplate::TemplateString::TemplateString(&local_1e0,"SEC3");
  TVar4.length_ = local_1a0.length_;
  TVar4.ptr_ = local_1a0.ptr_;
  TVar4.is_immutable_ = local_1a0.is_immutable_;
  TVar4._17_7_ = local_1a0._17_7_;
  TVar4.id_ = local_1a0.id_;
  TVar8.length_ = local_1c0.length_;
  TVar8.ptr_ = local_1c0.ptr_;
  TVar8.is_immutable_ = local_1c0.is_immutable_;
  TVar8._17_7_ = local_1c0._17_7_;
  TVar8.id_ = local_1c0.id_;
  TVar11.length_ = local_1e0.length_;
  TVar11.ptr_ = local_1e0.ptr_;
  TVar11.is_immutable_ = local_1e0.is_immutable_;
  TVar11._17_7_ = local_1e0._17_7_;
  TVar11.id_ = local_1e0.id_;
  ctemplate::TemplateDictionary::SetValueAndShowSection(TVar4,TVar8,TVar11);
  ctemplate::TemplateString::TemplateString((TemplateString *)&dump,"SEC1");
  bVar12 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&peer,(TemplateString *)&dump);
  if (bVar12) {
    pcVar14 = "!(peer.IsHiddenSection(\"SEC1\"))";
  }
  else {
    ctemplate::TemplateString::TemplateString((TemplateString *)&dump,"SEC2");
    bVar12 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&peer,(TemplateString *)&dump);
    if (bVar12) {
      ctemplate::TemplateString::TemplateString((TemplateString *)&dump,"SEC3");
      bVar12 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&peer,(TemplateString *)&dump);
      if (bVar12) {
        dump._M_dataplus._M_p = (pointer)&dump.field_2;
        dump._M_string_length = 0;
        dump.field_2._M_local_buf[0] = '\0';
        ctemplate::TemplateDictionary::DumpToString((string *)&dict,(int)&dump);
        iVar13 = strcmp(dump._M_dataplus._M_p,
                        "global dictionary {\n   BI_NEWLINE: >\n<\n   BI_SPACE: > <\n   GLOBAL: >top<\n};\ndictionary \'test_SetValueAndShowSection\' {\n   TOPLEVEL: >foo<\n   section SEC1 (dict 1 of 1) -->\n     dictionary \'test_SetValueAndShowSection/SEC1#1\' {\n       INSEC: >bar<\n     }\n}\n"
                       );
        if (iVar13 == 0) {
          std::__cxx11::string::~string((string *)&dump);
          ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
          return;
        }
        pcVar14 = "strcmp(dump.c_str(), expected) == 0";
      }
      else {
        pcVar14 = "peer.IsHiddenSection(\"SEC3\")";
      }
    }
    else {
      pcVar14 = "peer.IsHiddenSection(\"SEC2\")";
    }
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar14);
  exit(1);
}

Assistant:

TEST(TemplateDictionary, SetValueAndShowSection) {
  TemplateDictionary dict("test_SetValueAndShowSection");
  TemplateDictionaryPeer peer(&dict);
  dict.SetValue("TOPLEVEL", "foo");

  dict.SetValueAndShowSection("INSEC", "bar", "SEC1");
  dict.SetValueAndShowSection("NOTINSEC", "", "SEC2");
  dict.SetValueAndShowSection("NOTINSEC2", NULL, "SEC3");

  EXPECT_FALSE(peer.IsHiddenSection("SEC1"));
  EXPECT_TRUE(peer.IsHiddenSection("SEC2"));
  EXPECT_TRUE(peer.IsHiddenSection("SEC3"));

  // Again, we don't get subdicts, so we have to dump to check values
  string dump;
  dict.DumpToString(&dump);
  const char* const expected =
    ("global dictionary {\n"
     "   BI_NEWLINE: >\n"
     "<\n"
     "   BI_SPACE: > <\n"
     "   GLOBAL: >top<\n"
     "};\n"
     "dictionary 'test_SetValueAndShowSection' {\n"
     "   TOPLEVEL: >foo<\n"
     "   section SEC1 (dict 1 of 1) -->\n"
     "     dictionary 'test_SetValueAndShowSection/SEC1#1' {\n"
     "       INSEC: >bar<\n"
     "     }\n"
     "}\n");
  EXPECT_STREQ(dump.c_str(), expected);
}